

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTest.cc
# Opt level: O2

void check_string(char *file,int line,string *expected,string *received)

{
  __type _Var1;
  logic_error *this;
  
  _Var1 = std::operator==(expected,received);
  if (_Var1) {
    return;
  }
  fprintf(_stderr,"(%s:%d) Strings do not match; expected:\n",file);
  phosg::print_data((FILE *)_stderr,expected,0,(void *)0x0,2);
  fwrite("Received:\n",10,1,_stderr);
  phosg::print_data((FILE *)_stderr,received,0,(void *)0x0,2);
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this,"Strings do not match");
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void check_string(const char* file, int line, const string& expected, const string& received) {
  if (expected != received) {
    fprintf(stderr, "(%s:%d) Strings do not match; expected:\n", file, line);
    print_data(stderr, expected);
    fprintf(stderr, "Received:\n");
    print_data(stderr, received);
    throw logic_error("Strings do not match");
  }
}